

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_nex.cpp
# Opt level: O0

void dirNexScreenUlaTimex(byte scrType)

{
  int iVar1;
  int32_t iVar2;
  size_t __n;
  size_t sVar3;
  size_t pixelDataSize;
  size_t adrPixelData;
  aint hiResColor;
  byte scrType_local;
  
  adrPixelData._7_1_ = scrType;
  if (scrType == '\b') {
    adrPixelData._0_4_ = 0;
    iVar1 = ParseExpression(&lp,(aint *)&adrPixelData);
    if (iVar1 != 0) {
      if (((int)(uint)adrPixelData < 0) || (7 < (int)(uint)adrPixelData)) {
        Warning("[SAVENEX] value is not in 0..7 range",bp,W_PASS3);
      }
      nex.h.hiResColour = (byte)(((uint)adrPixelData & 7) << 3);
    }
  }
  nex.h.screen = adrPixelData._7_1_;
  iVar2 = CDevice::GetMemoryOffset(Device,10,0);
  iVar1 = 0x1800;
  if (adrPixelData._7_1_ == '\x02') {
    iVar1 = 0x1b00;
  }
  __n = (size_t)iVar1;
  sVar3 = fwrite(Device->Memory + iVar2,1,__n,(FILE *)nex.f);
  if (__n != sVar3) {
    Error("[SAVENEX] writing pixel data failed",(char *)0x0,FATAL);
  }
  if ((adrPixelData._7_1_ != '\x02') &&
     (sVar3 = fwrite(Device->Memory + (long)iVar2 + 0x2000,1,__n,(FILE *)nex.f), __n != sVar3)) {
    Error("[SAVENEX] writing pixel data failed",(char *)0x0,FATAL);
  }
  return;
}

Assistant:

static void dirNexScreenUlaTimex(byte scrType) {
// ;; SCREEN (SCR|SHC|SHR) [<hiResColour 0..7>]
	// parse argument (only HiRes screen type)
	if (SNexHeader::SCR_HIRES == scrType) {
		aint hiResColor = 0;
		if (ParseExpression(lp, hiResColor)) {
			if (hiResColor < 0 || 7 < hiResColor) Warning("[SAVENEX] value is not in 0..7 range", bp);
			nex.h.hiResColour = (hiResColor&7) << 3;
		}
	}
	// update header loading screen status
	nex.h.screen = scrType;
	// warn about invalid values
	size_t adrPixelData = Device->GetMemoryOffset(5*2, 0);
	size_t pixelDataSize = (SNexHeader::SCR_ULA == scrType) ? 0x1B00 : 0x1800;
	// write pixel data into file (from the default VRAM position of device)
	if (pixelDataSize != fwrite(Device->Memory + adrPixelData, 1, pixelDataSize, nex.f)) {
		Error("[SAVENEX] writing pixel data failed", NULL, FATAL);
	}
	if (SNexHeader::SCR_ULA == scrType) return;		//ULA is written in one go
	adrPixelData += 0x2000;							// address of second half of data
	// write [remaining] part of pixel data into file
	if (pixelDataSize != fwrite(Device->Memory + adrPixelData, 1, pixelDataSize, nex.f)) {
		Error("[SAVENEX] writing pixel data failed", NULL, FATAL);
	}
}